

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O0

void __thiscall sf::Shape::updateOutline(Shape *this)

{
  size_t sVar1;
  Vertex *pVVar2;
  Vertex *pVVar3;
  VertexArray *this_00;
  long in_RDI;
  float fVar4;
  Vector2<float> VVar5;
  FloatRect FVar6;
  Vector2f normal;
  float factor;
  Vector2f n2;
  Vector2f n1;
  Vector2f p2;
  Vector2f p1;
  Vector2f p0;
  size_t index;
  size_t i;
  size_t count;
  Vector2<float> *in_stack_ffffffffffffff28;
  VertexArray *in_stack_ffffffffffffff30;
  Vector2f *in_stack_ffffffffffffff38;
  Shape *in_stack_ffffffffffffff40;
  VertexArray *in_stack_ffffffffffffff50;
  undefined8 local_9c;
  undefined8 local_94;
  Vector2<float> local_60;
  Vector2<float> local_58;
  Vector2<float> local_50;
  Vector2f local_48;
  Vector2f local_40;
  Vector2f local_38;
  Vector2f local_30;
  Vector2f local_28;
  long local_20;
  ulong local_18;
  ulong local_10;
  
  if ((*(float *)(in_RDI + 0xd8) != 0.0) || (NAN(*(float *)(in_RDI + 0xd8)))) {
    sVar1 = VertexArray::getVertexCount((VertexArray *)0x21cd66);
    local_10 = sVar1 - 2;
    VertexArray::resize(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    for (local_18 = 0; local_18 < local_10; local_18 = local_18 + 1) {
      local_20 = local_18 + 1;
      if (local_18 == 0) {
        in_stack_ffffffffffffff50 =
             (VertexArray *)
             VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      }
      else {
        in_stack_ffffffffffffff50 =
             (VertexArray *)
             VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      }
      local_28 = *(Vector2f *)&in_stack_ffffffffffffff50->super_Drawable;
      in_stack_ffffffffffffff40 = (Shape *)(in_RDI + 0xe0);
      pVVar2 = VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      local_30 = pVVar2->position;
      pVVar2 = VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      local_38 = pVVar2->position;
      local_40 = anon_unknown.dwarf_1c7423::computeNormal
                           (in_stack_ffffffffffffff38,(Vector2f *)in_stack_ffffffffffffff30);
      local_48 = anon_unknown.dwarf_1c7423::computeNormal
                           (in_stack_ffffffffffffff38,(Vector2f *)in_stack_ffffffffffffff30);
      VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      local_50 = sf::operator-(in_stack_ffffffffffffff28,(Vector2<float> *)0x21cec7);
      fVar4 = anon_unknown.dwarf_1c7423::dotProduct(&local_40,&local_50);
      if (0.0 < fVar4) {
        local_58 = sf::operator-(in_stack_ffffffffffffff28);
        local_40 = local_58;
      }
      VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      local_60 = sf::operator-(in_stack_ffffffffffffff28,(Vector2<float> *)0x21cf38);
      fVar4 = anon_unknown.dwarf_1c7423::dotProduct(&local_48,&local_60);
      if (0.0 < fVar4) {
        local_48 = sf::operator-(in_stack_ffffffffffffff28);
      }
      sf::operator+(in_stack_ffffffffffffff28,(Vector2<float> *)0x21cfcf);
      operator/(in_stack_ffffffffffffff28,0.0);
      pVVar2 = VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      pVVar2->position = local_30;
      sf::operator*(in_stack_ffffffffffffff28,0.0);
      VVar5 = sf::operator+(in_stack_ffffffffffffff28,(Vector2<float> *)0x21d044);
      pVVar2 = VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      (pVVar2->position).x = VVar5.x;
      (pVVar2->position).y = VVar5.y;
    }
    pVVar2 = VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    pVVar3 = VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)pVVar2);
    pVVar3->position = pVVar2->position;
    this_00 = (VertexArray *)VertexArray::operator[](in_stack_ffffffffffffff30,(size_t)pVVar2);
    pVVar2 = VertexArray::operator[](this_00,(size_t)pVVar2);
    pVVar2->position = (Vector2f)(this_00->super_Drawable)._vptr_Drawable;
    updateOutlineColors(in_stack_ffffffffffffff40);
    FVar6 = VertexArray::getBounds(in_stack_ffffffffffffff50);
    local_9c = FVar6._0_8_;
    *(undefined8 *)(in_RDI + 0x140) = local_9c;
    local_94 = FVar6._8_8_;
    *(undefined8 *)(in_RDI + 0x148) = local_94;
  }
  else {
    VertexArray::clear((VertexArray *)0x21cd2f);
    *(undefined8 *)(in_RDI + 0x140) = *(undefined8 *)(in_RDI + 0x130);
    *(undefined8 *)(in_RDI + 0x148) = *(undefined8 *)(in_RDI + 0x138);
  }
  return;
}

Assistant:

void Shape::updateOutline()
{
    // Return if there is no outline
    if (m_outlineThickness == 0.f)
    {
        m_outlineVertices.clear();
        m_bounds = m_insideBounds;
        return;
    }

    std::size_t count = m_vertices.getVertexCount() - 2;
    m_outlineVertices.resize((count + 1) * 2);

    for (std::size_t i = 0; i < count; ++i)
    {
        std::size_t index = i + 1;

        // Get the two segments shared by the current point
        Vector2f p0 = (i == 0) ? m_vertices[count].position : m_vertices[index - 1].position;
        Vector2f p1 = m_vertices[index].position;
        Vector2f p2 = m_vertices[index + 1].position;

        // Compute their normal
        Vector2f n1 = computeNormal(p0, p1);
        Vector2f n2 = computeNormal(p1, p2);

        // Make sure that the normals point towards the outside of the shape
        // (this depends on the order in which the points were defined)
        if (dotProduct(n1, m_vertices[0].position - p1) > 0)
            n1 = -n1;
        if (dotProduct(n2, m_vertices[0].position - p1) > 0)
            n2 = -n2;

        // Combine them to get the extrusion direction
        float factor = 1.f + (n1.x * n2.x + n1.y * n2.y);
        Vector2f normal = (n1 + n2) / factor;

        // Update the outline points
        m_outlineVertices[i * 2 + 0].position = p1;
        m_outlineVertices[i * 2 + 1].position = p1 + normal * m_outlineThickness;
    }

    // Duplicate the first point at the end, to close the outline
    m_outlineVertices[count * 2 + 0].position = m_outlineVertices[0].position;
    m_outlineVertices[count * 2 + 1].position = m_outlineVertices[1].position;

    // Update outline colors
    updateOutlineColors();

    // Update the shape's bounds
    m_bounds = m_outlineVertices.getBounds();
}